

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O3

void QXkbCommon::setXkbContext(QPlatformInputContext *inputContext,xkb_context *context)

{
  byte bVar1;
  long in_FS_OFFSET;
  QStringView QVar2;
  QMetaMethod QVar3;
  QLatin1String QVar4;
  char *normalizedSignature;
  char *inputContextClassName;
  xkb_context *context_local;
  QPlatformInputContext *inputContext_local;
  QArrayData *local_48;
  xkb_context **local_40;
  char *local_38;
  char *local_30;
  QMetaTypeInterface *local_28;
  InterfaceType *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  context_local = context;
  inputContext_local = inputContext;
  if (context != (xkb_context *)0x0 && inputContext != (QPlatformInputContext *)0x0) {
    QObject::objectName();
    bVar1 = 1;
    if (local_38 == (char *)0x14) {
      QVar2.m_data = (storage_type_conflict *)local_40;
      QVar2.m_size = 0x14;
      QVar4.m_data = "QComposeInputContext";
      QVar4.m_size = 0x14;
      bVar1 = QtPrivate::equalStrings(QVar2,QVar4);
      bVar1 = bVar1 ^ 1;
    }
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    if (bVar1 == 0) {
      if (setXkbContext(QPlatformInputContext*,xkb_context*)::setXkbContext == '\0') {
        setXkbContext();
      }
      if (setXkbContext::setXkbContext.mobj != (QMetaObject *)0x0) {
        local_48 = (QArrayData *)0x0;
        local_40 = &context_local;
        local_38 = (char *)0x0;
        local_30 = "struct xkb_context*";
        local_28 = (QMetaTypeInterface *)0x0;
        local_20 = &QtPrivate::QMetaTypeInterfaceWrapper<xkb_context_*>::metaType;
        QVar3.data.d = setXkbContext::setXkbContext.data.d;
        QVar3.mobj = setXkbContext::setXkbContext.mobj;
        QMetaMethod::invokeImpl
                  (QVar3,inputContext_local,DirectConnection,2,&local_48,&local_38,&local_28);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXkbCommon::setXkbContext(QPlatformInputContext *inputContext, struct xkb_context *context)
{
    if (!inputContext || !context)
        return;

    const char *const inputContextClassName = "QComposeInputContext";
    const char *const normalizedSignature = "setXkbContext(xkb_context*)";

    if (inputContext->objectName() != QLatin1StringView(inputContextClassName))
        return;

    static const QMetaMethod setXkbContext = [&]() {
        int methodIndex = inputContext->metaObject()->indexOfMethod(normalizedSignature);
        QMetaMethod method = inputContext->metaObject()->method(methodIndex);
        Q_ASSERT(method.isValid());
        if (!method.isValid())
            qCWarning(lcQpaKeyMapper) << normalizedSignature << "not found on" << inputContextClassName;
        return method;
    }();

    if (!setXkbContext.isValid())
        return;

    setXkbContext.invoke(inputContext, Qt::DirectConnection, Q_ARG(struct xkb_context*, context));
}